

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

int buffer_get(void *data)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *(ulong *)((long)data + 0x10);
  uVar2 = 0xffffffff;
  if (uVar1 < *(ulong *)((long)data + 8)) {
    uVar2 = (uint)*(byte *)(*data + uVar1);
    *(ulong *)((long)data + 0x10) = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

static int buffer_get(void *data)
{
	char c;
	buffer_data_t *stream = data;
	if (stream->pos >= stream->len)
		return EOF;

	c = stream->data[stream->pos];
	stream->pos++;
	return (unsigned char)c;
}